

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sldperm.c
# Opt level: O2

int sldperm(int job,int n,int_t nnz,int_t *colptr,int_t *adjncy,float *nzval,int *perm,float *u,
           float *v)

{
  double *addr;
  long lVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  int_t num;
  int_t nnz_local;
  int_t ln;
  int_t ljob;
  int_t ldw;
  int_t local_184;
  double *local_180;
  int_t *local_178;
  double *local_170;
  int_t info [10];
  int_t icntl [10];
  
  nnz_local = nnz;
  local_170 = (double *)superlu_malloc((long)nnz << 3);
  local_184 = n * 10 + nnz;
  if (job != 3) {
    local_184 = n * 5;
  }
  local_178 = intMalloc(local_184);
  if (local_178 != (int_t *)0x0) {
    ldw = n * 3 + nnz;
    local_180 = (double *)superlu_malloc((long)ldw << 3);
    if (local_180 != (double *)0x0) {
      lVar3 = (long)n;
      for (lVar1 = 0; lVar1 <= lVar3; lVar1 = lVar1 + 1) {
        colptr[lVar1] = colptr[lVar1] + 1;
      }
      uVar2 = 0;
      uVar4 = (ulong)(uint)nnz;
      if (nnz < 1) {
        uVar4 = uVar2;
      }
      for (; uVar4 != uVar2; uVar2 = uVar2 + 1) {
        adjncy[uVar2] = adjncy[uVar2] + 1;
      }
      mc64id_(icntl);
      for (uVar2 = 0; uVar4 != uVar2; uVar2 = uVar2 + 1) {
        local_170[uVar2] = (double)nzval[uVar2];
      }
      ln = n;
      ljob = job;
      mc64ad_(&ljob,&ln,&nnz_local,colptr,adjncy,local_170,&num,perm,&local_184,local_178,&ldw,
              local_180,icntl,info);
      if (info[0] == 1) {
        printf(".. The last %d permutations:\n",(ulong)(uint)(n - num));
        slu_PrintInt10("perm",n - num,perm + num);
      }
      addr = local_180;
      for (lVar1 = 0; lVar1 <= lVar3; lVar1 = lVar1 + 1) {
        colptr[lVar1] = colptr[lVar1] + -1;
      }
      uVar2 = 0;
      uVar4 = (ulong)(uint)nnz_local;
      if (nnz_local < 1) {
        uVar4 = uVar2;
      }
      for (; uVar4 != uVar2; uVar2 = uVar2 + 1) {
        adjncy[uVar2] = adjncy[uVar2] + -1;
      }
      uVar2 = 0;
      uVar4 = (ulong)(uint)n;
      if (n < 1) {
        uVar4 = uVar2;
      }
      for (; uVar4 != uVar2; uVar2 = uVar2 + 1) {
        perm[uVar2] = perm[uVar2] + -1;
      }
      if (job == 5) {
        for (uVar2 = 0; uVar4 != uVar2; uVar2 = uVar2 + 1) {
          u[uVar2] = (float)local_180[uVar2];
          v[uVar2] = (float)local_180[lVar3 + uVar2];
        }
      }
      superlu_free(local_178);
      superlu_free(addr);
      superlu_free(local_170);
      return info[0];
    }
    sprintf((char *)icntl,"%s at line %d in file %s\n","Malloc fails for dw[]",0x72,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/sldperm.c");
    superlu_abort_and_exit((char *)icntl);
  }
  sprintf((char *)icntl,"%s at line %d in file %s\n","Malloc fails for iw[]",0x6f,
          "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/sldperm.c");
  superlu_abort_and_exit((char *)icntl);
}

Assistant:

int
sldperm(int job, int n, int_t nnz, int_t colptr[], int_t adjncy[],
	float nzval[], int *perm, float u[], float v[])
{
    int_t i, num;
    int_t icntl[10], info[10];
    int_t liw, ldw, *iw;
    double *dw;
    double *nzval_d = (double *) SUPERLU_MALLOC(nnz * sizeof(double));

#if ( DEBUGlevel>=1 )
    CHECK_MALLOC("Enter sldperm()");
#endif
    liw = 5*n;
    if ( job == 3 ) liw = 10*n + nnz;
    if ( !(iw = intMalloc(liw)) ) ABORT("Malloc fails for iw[]");
    ldw = 3*n + nnz;
    if ( !(dw = (double*) SUPERLU_MALLOC(ldw * sizeof(double))) )
          ABORT("Malloc fails for dw[]");
	    
    /* Increment one to get 1-based indexing. */
    for (i = 0; i <= n; ++i) ++colptr[i];
    for (i = 0; i < nnz; ++i) ++adjncy[i];
#if ( DEBUGlevel>=2 )
    printf("LDPERM(): n %d, nnz %lld\n", n, (long long) nnz);
    slu_PrintInt10("colptr", n+1, colptr);
    slu_PrintInt10("adjncy", nnz, adjncy);
#endif
	
    /* 
     * NOTE:
     * =====
     *
     * MC64AD assumes that column permutation vector is defined as:
     * perm(i) = j means column i of permuted A is in column j of original A.
     *
     * Since a symmetric permutation preserves the diagonal entries. Then
     * by the following relation:
     *     P'(A*P')P = P'A
     * we can apply inverse(perm) to rows of A to get large diagonal entries.
     * But, since 'perm' defined in MC64AD happens to be the reverse of
     * SuperLU's definition of permutation vector, therefore, it is already
     * an inverse for our purpose. We will thus use it directly.
     *
     */
    mc64id_(icntl);
#if 0
    /* Suppress error and warning messages. */
    icntl[0] = -1;
    icntl[1] = -1;
#endif

    int_t ljob = job, ln = n;
    
    for (i = 0; i < nnz; ++i) nzval_d[i] = nzval[i];
    mc64ad_(&ljob, &ln, &nnz, colptr, adjncy, nzval_d, &num, perm,
	    &liw, iw, &ldw, dw, icntl, info);

#if ( DEBUGlevel>=2 )
    slu_PrintInt10("perm", n, perm);
    printf(".. After MC64AD info %lld\tsize of matching %lld\n", (long long)info[0], (long long) num);
#endif
    if ( info[0] == 1 ) { /* Structurally singular */
        printf(".. The last %d permutations:\n", (int)(n-num));
	slu_PrintInt10("perm", n-num, &perm[num]);
    }

    /* Restore to 0-based indexing. */
    for (i = 0; i <= n; ++i) --colptr[i];
    for (i = 0; i < nnz; ++i) --adjncy[i];
    for (i = 0; i < n; ++i) --perm[i];

    if ( job == 5 )
        for (i = 0; i < n; ++i) {
	    u[i] = dw[i];
	    v[i] = dw[n+i];
	}

    SUPERLU_FREE(iw);
    SUPERLU_FREE(dw);
    SUPERLU_FREE(nzval_d);

#if ( DEBUGlevel>=1 )
    CHECK_MALLOC("Exit sldperm()");
#endif

    return info[0];
}